

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22c7f6c::PeerManagerImpl::FinalizeNode(PeerManagerImpl *this,CNode *node)

{
  size_t *psVar1;
  int *piVar2;
  _Rb_tree_header *p_Var3;
  long lVar4;
  long lVar5;
  _Base_ptr p_Var6;
  TxReconciliationTracker *this_00;
  AddrMan *this_01;
  NodeId peer;
  bool bVar7;
  _Self __tmp;
  _Base_ptr *pp_Var8;
  _Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
  *this_02;
  CNodeState *pCVar9;
  iterator __position;
  _Link_type p_Var10;
  _Link_type p_Var11;
  _Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
  *this_03;
  size_t sVar12;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> time;
  long lVar13;
  _List_node_base *p_Var14;
  Level level;
  _Link_type __p;
  _Link_type p_Var15;
  list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
  *plVar17;
  _Link_type p_Var18;
  _Self __tmp_1;
  _Link_type p_Var19;
  _Rb_tree_node_base *p_Var20;
  long in_FS_OFFSET;
  string_view source_file;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar21;
  string_view logging_function;
  _Base_ptr local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_90 [2];
  NodeId nodeid;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  unique_lock<std::mutex> local_68;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock29;
  key_type_conflict4 *pkVar16;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = node->id;
  nodeid = lVar5;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock28,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x6e2,false);
  local_98 = (_Base_ptr)0x0;
  a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_68,&this->m_peer_mutex,"m_peer_mutex"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x742,false);
  __p = (_Link_type)&(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
  pp_Var8 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var20 = (_Rb_tree_node_base *)__p;
  while (p_Var6 = *pp_Var8, p_Var6 != (_Base_ptr)0x0) {
    if (lVar5 <= *(long *)(p_Var6 + 1)) {
      p_Var20 = p_Var6;
    }
    pp_Var8 = &p_Var6->_M_left + (*(long *)(p_Var6 + 1) < lVar5);
  }
  if (((_Link_type)p_Var20 != __p) && (*(long *)(p_Var20 + 1) <= lVar5)) {
    local_98 = p_Var20[1]._M_parent;
    a_Stack_90[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[1]._M_left;
    p_Var20[1]._M_parent = (_Base_ptr)0x0;
    p_Var20[1]._M_left = (_Base_ptr)0x0;
    criticalblock29.super_unique_lock._M_device = (mutex_type *)0x0;
    criticalblock29.super_unique_lock._M_owns = false;
    criticalblock29.super_unique_lock._9_7_ = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &criticalblock29.super_unique_lock._M_owns);
    this_02 = (_Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
               *)std::_Rb_tree_rebalance_for_erase(p_Var20,(_Rb_tree_node_base *)__p);
    std::
    _Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
    ::_M_drop_node(this_02,__p);
    psVar1 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar1 = *psVar1 - 1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_68);
  if (local_98 == (_Base_ptr)0x0) {
    __assert_fail("peer != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x6ea,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  LOCK();
  (this->m_wtxid_relay_peers).super___atomic_base<int>._M_i =
       (this->m_wtxid_relay_peers).super___atomic_base<int>._M_i -
       (*(byte *)((long)&local_98[7]._M_color + 1) & 1);
  UNLOCK();
  if ((this->m_wtxid_relay_peers).super___atomic_base<int>._M_i < 0) {
    __assert_fail("m_wtxid_relay_peers >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x6ec,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_90);
  pCVar9 = State(this,nodeid);
  if (pCVar9 == (CNodeState *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x6ef,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  if (pCVar9->fSyncStarted == true) {
    this->nSyncStarted = this->nSyncStarted + -1;
  }
  plVar17 = &pCVar9->vBlocksInFlight;
  p_Var14 = (_List_node_base *)plVar17;
  while (p_Var14 = (((_List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                      *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var14 != (_List_node_base *)plVar17) {
    CBlockIndex::GetBlockHash((uint256 *)&criticalblock29,(CBlockIndex *)p_Var14[1]._M_next);
    pVar21 = std::
             multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
             ::equal_range(&this->mapBlocksInFlight,(uint256 *)&criticalblock29);
    __position._M_node = (_Base_ptr)pVar21.first._M_node;
    while (__position._M_node != pVar21.second._M_node._M_node) {
      if (*(long *)(__position._M_node + 2) == nodeid) {
        __position = std::
                     multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
                     ::erase_abi_cxx11_((multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
                                         *)&this->mapBlocksInFlight,__position);
      }
      else {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
    }
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock29,&this->m_tx_download_mutex,"m_tx_download_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x700,false);
  peer = nodeid;
  TxOrphanage::EraseForPeer(&this->m_orphanage,nodeid);
  p_Var15 = (_Link_type)peer;
  TxRequestTracker::DisconnectedPeer(&this->m_txrequest,peer);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock29.super_unique_lock);
  this_00 = (this->m_txreconciliation)._M_t.
            super___uniq_ptr_impl<TxReconciliationTracker,_std::default_delete<TxReconciliationTracker>_>
            ._M_t.
            super__Tuple_impl<0UL,_TxReconciliationTracker_*,_std::default_delete<TxReconciliationTracker>_>
            .super__Head_base<0UL,_TxReconciliationTracker_*,_false>._M_head_impl;
  if (this_00 != (TxReconciliationTracker *)0x0) {
    p_Var15 = (_Link_type)peer;
    TxReconciliationTracker::ForgetPeer(this_00,peer);
  }
  this->m_num_preferred_download_peers =
       this->m_num_preferred_download_peers - (uint)pCVar9->fPreferredDownload;
  piVar2 = &this->m_peers_downloading_from;
  *piVar2 = *piVar2 - (uint)((pCVar9->vBlocksInFlight).
                             super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                             ._M_impl._M_node.super__List_node_base._M_next !=
                            (_List_node_base *)plVar17);
  if (*piVar2 < 0) {
    __assert_fail("m_peers_downloading_from >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x707,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  piVar2 = &this->m_outbound_peers_with_protect_from_disconnect;
  *piVar2 = *piVar2 - (uint)(pCVar9->m_chain_sync).m_protect;
  if (*piVar2 < 0) {
    __assert_fail("m_outbound_peers_with_protect_from_disconnect >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x709,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  pp_Var8 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
  p_Var18 = (_Link_type)p_Var3;
  while( true ) {
    p_Var11 = (_Link_type)*pp_Var8;
    p_Var19 = p_Var18;
    if (p_Var11 == (_Link_type)0x0) goto LAB_00733760;
    lVar5 = *(long *)(p_Var11->_M_storage)._M_storage;
    lVar13 = 0x18;
    p_Var15 = p_Var18;
    if ((peer <= lVar5) && (lVar13 = 0x10, p_Var15 = p_Var11, lVar5 <= peer)) break;
    pp_Var8 = (_Base_ptr *)((p_Var11->_M_storage)._M_storage + lVar13 + -0x20);
    p_Var18 = p_Var15;
  }
  p_Var10 = (_Link_type)(p_Var11->super__Rb_tree_node_base)._M_right;
  p_Var19 = p_Var11;
  for (; p_Var11 = (_Link_type)(p_Var11->super__Rb_tree_node_base)._M_left,
      p_Var11 != (_Link_type)0x0;
      p_Var11 = (_Link_type)((p_Var11->_M_storage)._M_storage + (ulong)(lVar5 < peer) * 8 + -0x20))
  {
    lVar5 = *(long *)(p_Var11->_M_storage)._M_storage;
    if (peer <= lVar5) {
      p_Var19 = p_Var11;
    }
  }
  for (; p_Var10 != (_Link_type)0x0;
      p_Var10 = *(_Link_type *)
                 ((p_Var10->_M_storage)._M_storage + (ulong)(lVar5 <= peer) * 8 + -0x10)) {
    lVar5 = *(long *)(p_Var10->_M_storage)._M_storage;
    if (peer < lVar5) {
      p_Var18 = p_Var10;
    }
  }
LAB_00733760:
  if (((_Link_type)(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
       p_Var19) && ((_Link_type)p_Var3 == p_Var18)) {
    std::
    _Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
    ::_M_erase((_Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
                *)(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
               p_Var15);
    (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header
    ;
    (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  else {
    while (p_Var19 != p_Var18) {
      p_Var11 = (_Link_type)std::_Rb_tree_increment(&p_Var19->super__Rb_tree_node_base);
      p_Var15 = (_Link_type)p_Var3;
      this_03 = (_Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
                 *)std::_Rb_tree_rebalance_for_erase
                             (&p_Var19->super__Rb_tree_node_base,&p_Var3->_M_header);
      std::
      _Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
      ::_M_drop_node(this_03,p_Var15);
      psVar1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *psVar1 = *psVar1 - 1;
      p_Var19 = p_Var11;
    }
    if ((this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    goto LAB_00733867;
  }
  if ((this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __assert_fail("mapBlocksInFlight.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x70f,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  if (this->m_num_preferred_download_peers != 0) {
    __assert_fail("m_num_preferred_download_peers == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x710,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  if (this->m_peers_downloading_from != 0) {
    __assert_fail("m_peers_downloading_from == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x711,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  if (this->m_outbound_peers_with_protect_from_disconnect != 0) {
    __assert_fail("m_outbound_peers_with_protect_from_disconnect == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x712,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  if ((this->m_wtxid_relay_peers).super___atomic_base<int>._M_i != 0) {
    __assert_fail("m_wtxid_relay_peers == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x713,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock29,&this->m_tx_download_mutex,"m_tx_download_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x714,false);
  sVar12 = TxRequestTracker::Size(&this->m_txrequest);
  if (sVar12 != 0) {
    __assert_fail("m_txrequest.Size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x715,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  if ((this->m_orphanage).m_orphans._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __assert_fail("m_orphanage.Size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x716,
                  "virtual void (anonymous namespace)::PeerManagerImpl::FinalizeNode(const CNode &)"
                 );
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock29.super_unique_lock);
LAB_00733867:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock28.super_unique_lock);
  if ((((node->fSuccessfullyConnected)._M_base._M_i & 1U) != 0) &&
     ((node->m_conn_type & ~BLOCK_RELAY) != INBOUND)) {
    this_01 = this->m_addrman;
    time = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    AddrMan::Connected(this_01,&(node->addr).super_CService,(NodeSeconds)time.__d.__r);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock29,&this->m_headers_presync_mutex,"m_headers_presync_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x721,false);
  pkVar16 = &nodeid;
  std::
  _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
  ::erase(&(this->m_headers_presync_stats)._M_t,&nodeid);
  level = (Level)pkVar16;
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock29.super_unique_lock);
  bVar7 = ::LogAcceptCategory(NET,level);
  if (bVar7) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
    ;
    source_file._M_len = 0x62;
    logging_function._M_str = "FinalizeNode";
    logging_function._M_len = 0xc;
    LogPrintFormatInternal<long>
              (logging_function,source_file,0x724,NET,Debug,(ConstevalFormatString<1U>)0xc9cbae,
               &nodeid);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::FinalizeNode(const CNode& node)
{
    NodeId nodeid = node.GetId();
    {
    LOCK(cs_main);
    {
        // We remove the PeerRef from g_peer_map here, but we don't always
        // destruct the Peer. Sometimes another thread is still holding a
        // PeerRef, so the refcount is >= 1. Be careful not to do any
        // processing here that assumes Peer won't be changed before it's
        // destructed.
        PeerRef peer = RemovePeer(nodeid);
        assert(peer != nullptr);
        m_wtxid_relay_peers -= peer->m_wtxid_relay;
        assert(m_wtxid_relay_peers >= 0);
    }
    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    if (state->fSyncStarted)
        nSyncStarted--;

    for (const QueuedBlock& entry : state->vBlocksInFlight) {
        auto range = mapBlocksInFlight.equal_range(entry.pindex->GetBlockHash());
        while (range.first != range.second) {
            auto [node_id, list_it] = range.first->second;
            if (node_id != nodeid) {
                range.first++;
            } else {
                range.first = mapBlocksInFlight.erase(range.first);
            }
        }
    }
    {
        LOCK(m_tx_download_mutex);
        m_orphanage.EraseForPeer(nodeid);
        m_txrequest.DisconnectedPeer(nodeid);
    }
    if (m_txreconciliation) m_txreconciliation->ForgetPeer(nodeid);
    m_num_preferred_download_peers -= state->fPreferredDownload;
    m_peers_downloading_from -= (!state->vBlocksInFlight.empty());
    assert(m_peers_downloading_from >= 0);
    m_outbound_peers_with_protect_from_disconnect -= state->m_chain_sync.m_protect;
    assert(m_outbound_peers_with_protect_from_disconnect >= 0);

    m_node_states.erase(nodeid);

    if (m_node_states.empty()) {
        // Do a consistency check after the last peer is removed.
        assert(mapBlocksInFlight.empty());
        assert(m_num_preferred_download_peers == 0);
        assert(m_peers_downloading_from == 0);
        assert(m_outbound_peers_with_protect_from_disconnect == 0);
        assert(m_wtxid_relay_peers == 0);
        LOCK(m_tx_download_mutex);
        assert(m_txrequest.Size() == 0);
        assert(m_orphanage.Size() == 0);
    }
    } // cs_main
    if (node.fSuccessfullyConnected &&
        !node.IsBlockOnlyConn() && !node.IsInboundConn()) {
        // Only change visible addrman state for full outbound peers.  We don't
        // call Connected() for feeler connections since they don't have
        // fSuccessfullyConnected set.
        m_addrman.Connected(node.addr);
    }
    {
        LOCK(m_headers_presync_mutex);
        m_headers_presync_stats.erase(nodeid);
    }
    LogDebug(BCLog::NET, "Cleared nodestate for peer=%d\n", nodeid);
}